

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_get_options_may_be_read_from_the_wire_Test::
TestBody(WelcomeMessageTest_test_get_options_may_be_read_from_the_wire_Test *this)

{
  bool bVar1;
  char *message_00;
  AssertHelper local_88;
  Message local_80;
  uint local_78 [2];
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  WelcomeMessage message;
  WelcomeMessageTest_test_get_options_may_be_read_from_the_wire_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"570701000010e1000026ae",&local_49);
  ReadWelcomeMessage((string *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_78[1] = 7;
  local_78[0] = bidfx_public_api::price::pixie::WelcomeMessage::GetOptions();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_70,"7","message.GetOptions()",(int *)(local_78 + 1),local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x3f,message_00);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_get_options_may_be_read_from_the_wire)
{
    WelcomeMessage message = ReadWelcomeMessage("570701000010e1000026ae");
    ASSERT_EQ(7, message.GetOptions());
}